

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# direct_request.hpp
# Opt level: O0

void __thiscall libtorrent::dht::direct_observer::timeout(direct_observer *this)

{
  bool bVar1;
  direct_traversal *this_00;
  endpoint local_9c;
  undefined1 local_80 [8];
  msg m;
  bdecode_node e;
  direct_observer *this_local;
  
  e._62_1_ = (this->super_observer).flags.m_val;
  e._61_1_ = 0x80;
  e._63_1_ = libtorrent::flags::operator&
                       ((bitfield_flag<unsigned_char,_libtorrent::dht::observer_flags_tag,_void>)
                        e._62_1_,(bitfield_flag<unsigned_char,_libtorrent::dht::observer_flags_tag,_void>
                                  )0x80);
  bVar1 = libtorrent::flags::bitfield_flag::operator_cast_to_bool((bitfield_flag *)&e.field_0x3f);
  if (!bVar1) {
    e._60_1_ = 0x80;
    libtorrent::flags::bitfield_flag<unsigned_char,_libtorrent::dht::observer_flags_tag,_void>::
    operator|=(&(this->super_observer).flags,
               (bitfield_flag<unsigned_char,_libtorrent::dht::observer_flags_tag,_void>)0x80);
    bdecode_node::bdecode_node((bdecode_node *)((long)&m.addr.impl_.data_ + 0x18));
    observer::target_ep(&local_9c,&this->super_observer);
    dht::msg::msg((msg *)local_80,(bdecode_node *)((long)&m.addr.impl_.data_ + 0x18),&local_9c);
    this_00 = (direct_traversal *)observer::algorithm(&this->super_observer);
    direct_traversal::invoke_cb(this_00,(msg *)local_80);
    bdecode_node::~bdecode_node((bdecode_node *)((long)&m.addr.impl_.data_ + 0x18));
  }
  return;
}

Assistant:

void timeout() override
	{
		if (flags & flag_done) return;
		flags |= flag_done;
		bdecode_node e;
		msg m(e, target_ep());
		static_cast<direct_traversal*>(algorithm())->invoke_cb(m);
	}